

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

int * parasail_result_get_similar_row(parasail_result_t *result)

{
  int iVar1;
  parasail_result_t *result_local;
  
  if (result == (parasail_result_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_result_get_similar_row","result");
    result_local = (parasail_result_t *)0x0;
  }
  else {
    iVar1 = parasail_result_is_stats_rowcol(result);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s: assert(%s) failed\n","parasail_result_get_similar_row",
              "parasail_result_is_stats_rowcol(result)");
      result_local = (parasail_result_t *)0x0;
    }
    else {
      result_local = *(parasail_result_t **)
                      ((long)((result->field_4).trace)->trace_del_table + 0x10);
    }
  }
  return &result_local->score;
}

Assistant:

int* parasail_result_get_similar_row(const parasail_result_t * const restrict result)
{
    PARASAIL_CHECK_NULL(result);
    PARASAIL_ASSERT(parasail_result_is_stats_rowcol(result));
    return result->stats->rowcols->similar_row;
}